

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O2

void __thiscall gv_visitor::visit(gv_visitor *this,MethodInvocation *ptr)

{
  Expr *second;
  Expressions *second_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  allocator<char> local_21;
  
  std::operator+(&local_48,"method invocation: ",ptr->name);
  box(this,ptr,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  second = ptr->from;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"caller",&local_21);
  arrow(this,ptr,second,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (**(ptr->from->super_Base)._vptr_Base)(ptr->from,this);
  second_00 = ptr->args;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"args",&local_21);
  arrow(this,ptr,second_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (**(ptr->args->super_Base)._vptr_Base)(ptr->args,this);
  return;
}

Assistant:

void gv_visitor::visit(MethodInvocation* ptr) {
    box(ptr, "method invocation: " + *ptr->name);
    arrow(ptr, ptr->from, "caller");
    ptr->from->accept(this);
    arrow(ptr, ptr->args, "args");
    ptr->args->accept(this);
    //name
}